

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void internal_malloc_stats(mstate m)

{
  bool bVar1;
  ulong local_50;
  mchunkptr local_38;
  mchunkptr q;
  msegmentptr s;
  size_t used;
  size_t fp;
  size_t maxfp;
  mstate m_local;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  fp = 0;
  used = 0;
  s = (msegmentptr)0x0;
  if (m->top != (mchunkptr)0x0) {
    fp = m->max_footprint;
    used = m->footprint;
    s = (msegmentptr)(used - (m->topsize + 0x50));
    for (q = (mchunkptr)&m->seg; q != (mchunkptr)0x0; q = q->fd) {
      if ((q->prev_foot + 0x10 & 0xf) == 0) {
        local_50 = 0;
      }
      else {
        local_50 = 0x10 - (q->prev_foot + 0x10 & 0xf) & 0xf;
      }
      local_38 = (mchunkptr)(q->prev_foot + local_50);
      while( true ) {
        bVar1 = false;
        if ((((mchunkptr)q->prev_foot <= local_38) &&
            (bVar1 = false, local_38 < (mchunkptr)(q->prev_foot + q->head))) &&
           (bVar1 = false, local_38 != m->top)) {
          bVar1 = local_38->head != 0xb;
        }
        if (!bVar1) break;
        if ((local_38->head & 3) == 1) {
          s = (msegmentptr)((long)s - (local_38->head & 0xfffffffffffffff8));
        }
        local_38 = (mchunkptr)((long)&local_38->prev_foot + (local_38->head & 0xfffffffffffffff8));
      }
    }
  }
  fprintf(_stderr,"max system bytes = %10lu\n",fp);
  fprintf(_stderr,"system bytes     = %10lu\n",used);
  fprintf(_stderr,"in use bytes     = %10lu\n",s);
  return;
}

Assistant:

static void internal_malloc_stats(mstate m) {
  ensure_initialization();
  if (!PREACTION(m)) {
    size_t maxfp = 0;
    size_t fp = 0;
    size_t used = 0;
    check_malloc_state(m);
    if (is_initialized(m)) {
      msegmentptr s = &m->seg;
      maxfp = m->max_footprint;
      fp = m->footprint;
      used = fp - (m->topsize + TOP_FOOT_SIZE);

      while (s != 0) {
        mchunkptr q = align_as_chunk(s->base);
        while (segment_holds(s, q) &&
               q != m->top && q->head != FENCEPOST_HEAD) {
          if (!is_inuse(q))
            used -= chunksize(q);
          q = next_chunk(q);
        }
        s = s->next;
      }
    }
    POSTACTION(m); /* drop lock */
    fprintf(stderr, "max system bytes = %10lu\n", (unsigned long)(maxfp));
    fprintf(stderr, "system bytes     = %10lu\n", (unsigned long)(fp));
    fprintf(stderr, "in use bytes     = %10lu\n", (unsigned long)(used));
  }
}